

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::WaitSyncInvalidFlagTest::iterate(WaitSyncInvalidFlagTest *this)

{
  ostringstream *poVar1;
  EGLSyncKHR *value;
  EGLDisplay *value_00;
  EGLenum EVar2;
  TestLog *pTVar3;
  int iVar4;
  deUint32 err;
  int iVar5;
  Library *pLVar6;
  undefined4 extraout_var;
  MessageBuilder *pMVar7;
  TestError *this_00;
  char *pcVar8;
  qpTestResult testResult;
  char *pcVar9;
  TestContext *this_01;
  Enum<int,_2UL> local_1c0;
  MessageBuilder local_1b0;
  
  pLVar6 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar3 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*pLVar6->_vptr_Library[0x11])
                    (pLVar6,(this->super_SyncTest).m_eglDisplay,
                     (ulong)(this->super_SyncTest).m_syncType,0);
  value = &(this->super_SyncTest).m_sync;
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar4);
  local_1b0.m_log = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_1b0,value);
  std::operator<<((ostream *)&pMVar7->m_str," = eglCreateSyncKHR(");
  value_00 = &(this->super_SyncTest).m_eglDisplay;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,value_00);
  poVar1 = &pMVar7->m_str;
  std::operator<<((ostream *)poVar1,", ");
  EVar2 = (this->super_SyncTest).m_syncType;
  pcVar8 = "<Unknown>";
  if (EVar2 == 0x30fa) {
    pcVar8 = "EGL_SYNC_REUSABLE_KHR";
  }
  pcVar9 = "EGL_SYNC_FENCE_KHR";
  if (EVar2 != 0x30f9) {
    pcVar9 = pcVar8;
  }
  std::operator<<((ostream *)poVar1,pcVar9);
  std::operator<<((ostream *)poVar1,", NULL)");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  err = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(err,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x496);
  iVar4 = (*pLVar6->_vptr_Library[0x3a])(pLVar6,*value_00,*value,0xffffffffffffffff);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::ostream::operator<<(poVar1,iVar4);
  std::operator<<((ostream *)poVar1," = eglWaitSyncKHR(");
  pMVar7 = tcu::MessageBuilder::operator<<(&local_1b0,value_00);
  std::operator<<((ostream *)&pMVar7->m_str,", ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,value);
  std::operator<<((ostream *)&pMVar7->m_str,", 0xFFFFFFFF)");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  iVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::ostream::operator<<(poVar1,iVar5);
  std::operator<<((ostream *)poVar1," = eglGetError()");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (iVar5 == 0x300c) {
    if (iVar4 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"status == EGL_FALSE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x4a5);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar8 = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Unexpected error \'");
    local_1c0.m_getName = eglu::getErrorName;
    local_1c0.m_value = iVar5;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"\' expected EGL_BAD_PARAMETER");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar8 = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_01,testResult,pcVar8);
  return STOP;
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		EGLint status = egl.waitSyncKHR(m_eglDisplay, m_sync, 0xFFFFFFFF);
		log << TestLog::Message << status << " = eglWaitSyncKHR(" << m_eglDisplay << ", " << m_sync << ", 0xFFFFFFFF)" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_PARAMETER)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_PARAMETER" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(status == EGL_FALSE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}